

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::Result::~Result(Result *this)

{
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__Result_001274f8;
  std::__cxx11::string::~string((string *)&this->details);
  return;
}

Assistant:

~Result			(void) {}